

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.h
# Opt level: O2

string * __thiscall
MinVR::VRDataIndex::addData
          (string *__return_storage_ptr__,VRDataIndex *this,string *name,
          VRFloatArrayConvertible *object)

{
  _Vector_base<float,_std::allocator<float>_> _Stack_38;
  
  (**object->_vptr_VRFloatArrayConvertible)(&_Stack_38,object);
  addData(__return_storage_ptr__,this,name,(VRFloatArray *)&_Stack_38);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&_Stack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string addData(const std::string &name, const VRFloatArrayConvertible &object) {
    return addData(name, object.toVRFloatArray());
  }